

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Namespace.h
# Opt level: O0

Namespace __thiscall luabridge::Namespace::endNamespace(Namespace *this)

{
  logic_error *this_00;
  undefined8 extraout_RDX;
  Namespace *in_RSI;
  Namespace NVar1;
  Namespace *this_local;
  
  if ((in_RSI->super_Registrar).m_stackSize == 1) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"endNamespace () called on global namespace");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if (1 < (in_RSI->super_Registrar).m_stackSize) {
    (in_RSI->super_Registrar).m_stackSize = (in_RSI->super_Registrar).m_stackSize + -1;
    lua_settop((in_RSI->super_Registrar).L,-2);
    Namespace(this,in_RSI);
    NVar1.super_Registrar._8_8_ = extraout_RDX;
    NVar1.super_Registrar.L = (lua_State *)this;
    return (Namespace)NVar1.super_Registrar;
  }
  __assert_fail("m_stackSize > 1",
                "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/LuaBridge/Source/LuaBridge/detail/Namespace.h"
                ,0x456,"Namespace luabridge::Namespace::endNamespace()");
}

Assistant:

Namespace endNamespace()
    {
        if (m_stackSize == 1)
        {
            throw std::logic_error("endNamespace () called on global namespace");
        }

        assert(m_stackSize > 1);
        --m_stackSize;
        lua_pop(L, 1);
        return Namespace(*this);
    }